

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O0

void __thiscall libcalc::Tokenizer::clear(Tokenizer *this)

{
  Token *this_00;
  bool bVar1;
  reference ppTVar2;
  Token *t;
  iterator __end1;
  iterator __begin1;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *__range1;
  Tokenizer *this_local;
  
  __end1 = std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::begin(&this->tokens);
  t = (Token *)std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::end(&this->tokens);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                *)&t);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppTVar2;
    if (this_00 != (Token *)0x0) {
      Token::~Token(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::clear(&this->tokens);
  return;
}

Assistant:

void Tokenizer::clear() {
  for (Token *t : tokens) {
    delete t;
  }

  tokens.clear();
}